

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::Payload<(Protocol::MQTT::Common::ControlPacketType)1>::getFilteredSize
          (Payload<(Protocol::MQTT::Common::ControlPacketType)1> *this)

{
  uchar uVar1;
  uint32 uVar2;
  uint32 local_1c;
  uint32 s;
  Payload<(Protocol::MQTT::Common::ControlPacketType)1> *this_local;
  
  local_1c = 0;
  if (this->fixedHeader == (FixedField<(Protocol::MQTT::Common::ControlPacketType)1> *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    uVar1 = Common::BitField::operator_cast_to_unsigned_char
                      ((BitField *)
                       &(this->fixedHeader->super_ConnectHeaderImpl).field_2.usernameFlag);
    if (uVar1 != '\0') {
      local_1c = WillMessage::getSize(this->willMessage);
    }
    uVar1 = Common::BitField::operator_cast_to_unsigned_char
                      ((BitField *)
                       &(this->fixedHeader->super_ConnectHeaderImpl).field_2.usernameFlag);
    if (uVar1 != '\0') {
      uVar2 = Common::DynamicStringView::getSize(&this->username);
      local_1c = uVar2 + local_1c;
    }
    uVar1 = Common::BitField::operator_cast_to_unsigned_char
                      ((BitField *)
                       &(this->fixedHeader->super_ConnectHeaderImpl).field_2.usernameFlag);
    if (uVar1 != '\0') {
      uVar2 = Common::DynamicBinDataView::getSize(&this->password);
      local_1c = uVar2 + local_1c;
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

uint32 getFilteredSize() const
                {
                    uint32 s = 0;
                    if (!fixedHeader) return s;
                    if (fixedHeader->willFlag)      s += willMessage->getSize();
                    if (fixedHeader->usernameFlag)  s += username.getSize();
                    if (fixedHeader->passwordFlag)  s += password.getSize();
                    return s;
                }